

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_finishOp(lua_State *L)

{
  uint uVar1;
  CallInfo *pCVar2;
  StkId pTVar3;
  StkId pTVar4;
  undefined4 uVar5;
  int total_00;
  Value *pVVar6;
  bool local_62;
  bool local_61;
  TValue *io1_2;
  TValue *io1_1;
  int total;
  int b;
  StkId top;
  int res;
  TValue *io1;
  OpCode op;
  Instruction inst;
  StkId base;
  CallInfo *ci;
  lua_State *L_local;
  
  pCVar2 = L->ci;
  pTVar3 = (pCVar2->u).l.base;
  uVar1 = *(uint *)((pCVar2->u).c.old_errfunc + -4);
  switch(uVar1 & 0x3f) {
  case 6:
  case 7:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1c:
    pVVar6 = &pTVar3[(int)(uVar1 >> 6 & 0xff)].value_;
    pTVar3 = L->top;
    L->top = pTVar3 + -1;
    *pVVar6 = pTVar3[-1].value_;
    pVVar6[1] = *(Value *)&pTVar3[-1].tt_;
    break;
  case 8:
  case 10:
  case 0x25:
    break;
  default:
    break;
  case 0x1d:
    pTVar4 = L->top;
    total_00 = (int)((long)pTVar4 + (-0x20 - (long)(pTVar3 + (int)(uVar1 >> 0x17))) >> 4);
    pTVar4[-3].value_ = pTVar4[-1].value_;
    uVar5 = *(undefined4 *)&pTVar4[-1].field_0xc;
    pTVar4[-3].tt_ = pTVar4[-1].tt_;
    *(undefined4 *)&pTVar4[-3].field_0xc = uVar5;
    if (1 < total_00) {
      L->top = pTVar4 + -2;
      luaV_concat(L,total_00);
    }
    pVVar6 = &(pCVar2->u).l.base[(int)(uVar1 >> 6 & 0xff)].value_;
    pTVar3 = L->top;
    *pVVar6 = pTVar3[-1].value_;
    pVVar6[1] = *(Value *)&pTVar3[-1].tt_;
    L->top = pCVar2->top;
    break;
  case 0x1f:
  case 0x20:
  case 0x21:
    local_61 = true;
    if (L->top[-1].tt_ != 0) {
      local_62 = false;
      if (L->top[-1].tt_ == 1) {
        local_62 = L->top[-1].value_.b == 0;
      }
      local_61 = local_62;
    }
    top._4_4_ = (uint)((local_61 ^ 0xffU) & 1);
    L->top = L->top + -1;
    if ((pCVar2->callstatus & 0x80) != 0) {
      pCVar2->callstatus = pCVar2->callstatus ^ 0x80;
      top._4_4_ = (uint)((top._4_4_ != 0 ^ 0xffU) & 1);
    }
    if (top._4_4_ != (uVar1 >> 6 & 0xff)) {
      (pCVar2->u).l.savedpc = (Instruction *)((pCVar2->u).c.old_errfunc + 4);
    }
    break;
  case 0x24:
    if (-1 < (int)((uVar1 >> 0xe & 0x1ff) - 1)) {
      L->top = pCVar2->top;
    }
    break;
  case 0x29:
    L->top = pCVar2->top;
  }
  return;
}

Assistant:

void luaV_finishOp(lua_State *L) {
    CallInfo *ci = L->ci;
    StkId base = ci->u.l.base;
    Instruction inst = *(ci->u.l.savedpc - 1);  /* interrupted instruction */
    OpCode op = GET_OPCODE(inst);
    switch (op) {  /* finish its execution */
        case OP_ADD:
        case OP_SUB:
        case OP_MUL:
        case OP_DIV:
        case OP_IDIV:
        case OP_BAND:
        case OP_BOR:
        case OP_BXOR:
        case OP_SHL:
        case OP_SHR:
        case OP_MOD:
        case OP_POW:
        case OP_UNM:
        case OP_BNOT:
        case OP_LEN:
        case OP_GETTABUP:
        case OP_GETTABLE:
        case OP_SELF: {
            setobjs2s(L, base + GETARG_A(inst), --L->top);
            break;
        }
        case OP_LE:
        case OP_LT:
        case OP_EQ: {
            int res = !l_isfalse(L->top - 1);
            L->top--;
            if (ci->callstatus & CIST_LEQ) {  /* "<=" using "<" instead? */
                lua_assert(op == OP_LE);
                ci->callstatus ^= CIST_LEQ;  /* clear mark */
                res = !res;  /* negate result */
            }
            lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_JMP);
            if (res != GETARG_A(inst))  /* condition failed? */
                ci->u.l.savedpc++;  /* skip jump instruction */
            break;
        }
        case OP_CONCAT: {
            StkId top = L->top - 1;  /* top when 'luaT_trybinTM' was called */
            int b = GETARG_B(inst);      /* first element to concatenate */
            int total = cast_int(top - 1 - (base + b));  /* yet to concatenate */
            setobj2s(L, top - 2, top);  /* put TM result in proper position */
            if (total > 1) {  /* are there elements to concat? */
                L->top = top - 1;  /* top is one after last element (at top-2) */
                luaV_concat(L, total);  /* concat them (may yield again) */
            }
            /* move final result to final position */
            setobj2s(L, ci->u.l.base + GETARG_A(inst), L->top - 1);
            L->top = ci->top;  /* restore top */
            break;
        }
        case OP_TFORCALL: {
            lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_TFORLOOP);
            L->top = ci->top;  /* correct top */
            break;
        }
        case OP_CALL: {
            if (GETARG_C(inst) - 1 >= 0)  /* nresults >= 0? */
                L->top = ci->top;  /* adjust results */
            break;
        }
        case OP_TAILCALL:
        case OP_SETTABUP:
        case OP_SETTABLE:
            break;
        default:
            lua_assert(0);
    }
}